

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLoader.cpp
# Opt level: O2

TextureMapId __thiscall
COLLADASaxFWL::Loader::getTextureMapIdBySematic(Loader *this,String *semantic)

{
  iterator iVar1;
  mapped_type *pmVar2;
  mapped_type mVar3;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->mTextureMapSemanticTextureMapIdMap)._M_t,semantic);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->mTextureMapSemanticTextureMapIdMap)._M_t._M_impl.super__Rb_tree_header) {
    mVar3 = this->mNextTextureMapId;
    this->mNextTextureMapId = mVar3 + 1;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->mTextureMapSemanticTextureMapIdMap,semantic);
    *pmVar2 = mVar3;
  }
  else {
    mVar3 = *(mapped_type *)(iVar1._M_node + 2);
  }
  return mVar3;
}

Assistant:

COLLADAFW::TextureMapId Loader::getTextureMapIdBySematic( const String& semantic )
	{
		StringTextureMapIdMap::iterator it = mTextureMapSemanticTextureMapIdMap.find(semantic);
		if ( it == mTextureMapSemanticTextureMapIdMap.end() )
		{
			return mTextureMapSemanticTextureMapIdMap[semantic] = mNextTextureMapId++;
		}
		else
		{
			return it->second;
		}
	}